

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceEffectsObserver.cpp
# Opt level: O2

void __thiscall DiceEffectsObserver::update(DiceEffectsObserver *this)

{
  Player *pPVar1;
  pointer ppPVar2;
  __type _Var3;
  int iVar4;
  Dice *pDVar5;
  Player *this_00;
  ostream *poVar6;
  mapped_type *pmVar7;
  string *psVar8;
  string *__rhs;
  pointer ppPVar9;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  unresolvedHand;
  key_type local_64;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_60;
  
  pDVar5 = (Dice *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Dice::typeinfo,0);
  Dice::diceHistoricalValues(pDVar5);
  pDVar5 = (Dice *)__dynamic_cast(this->concreteSubject,&Subject::typeinfo,&Dice::typeinfo,0);
  iVar4 = Dice::getPlayerNumber(pDVar5);
  this_00 = Game::getPlayerByID(iVar4);
  pDVar5 = Player::getDice(this_00);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::_Rb_tree(&local_60,&(pDVar5->DiceValues)._M_t);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\n****************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "-------------------- DICE EFFECT OBSERVER ----------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "****************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "*************  The potential effect of your roll is : **********************"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  local_64 = Energy;
  pmVar7 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)&local_60,&local_64);
  if (0 < *pmVar7) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Player: ");
    psVar8 = Player::getPlayerName_abi_cxx11_(this_00);
    poVar6 = std::operator<<(poVar6,(string *)psVar8);
    poVar6 = std::operator<<(poVar6," added ");
    local_64 = Energy;
    pmVar7 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                           *)&local_60,&local_64);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*pmVar7);
    poVar6 = std::operator<<(poVar6," energy points");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  local_64 = Attack;
  pmVar7 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)&local_60,&local_64);
  if (0 < *pmVar7) {
    iVar4 = Player::getZone(this_00);
    if ((iVar4 < 1) ||
       (iVar4 = Player::getZone(this_00),
       ppPVar2 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,
       ppPVar9 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                 super__Vector_impl_data._M_start, 6 < iVar4)) {
      iVar4 = Player::getZone(this_00);
      ppPVar2 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppPVar9 = Game::players.super__Vector_base<Player_*,_std::allocator<Player_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (6 < iVar4) {
        for (; ppPVar9 != ppPVar2; ppPVar9 = ppPVar9 + 1) {
          pPVar1 = *ppPVar9;
          psVar8 = Player::getPlayerName_abi_cxx11_(pPVar1);
          __rhs = Player::getPlayerName_abi_cxx11_(this_00);
          _Var3 = std::operator==(psVar8,__rhs);
          if (((!_Var3) && (iVar4 = Player::getZone(pPVar1), 0 < iVar4)) &&
             (iVar4 = Player::getZone(pPVar1), iVar4 < 7)) {
            poVar6 = std::operator<<((ostream *)&std::cout,"Player: ");
            psVar8 = Player::getPlayerName_abi_cxx11_(pPVar1);
            poVar6 = std::operator<<(poVar6,(string *)psVar8);
            poVar6 = std::operator<<(poVar6," removed ");
            local_64 = Attack;
            pmVar7 = std::
                     map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                     ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                                   *)&local_60,&local_64);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*pmVar7);
            poVar6 = std::operator<<(poVar6," life points since he is inside manhattan");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
      }
    }
    else {
      for (; ppPVar9 != ppPVar2; ppPVar9 = ppPVar9 + 1) {
        pPVar1 = *ppPVar9;
        iVar4 = Player::getZone(pPVar1);
        if (6 < iVar4) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Player: ");
          psVar8 = Player::getPlayerName_abi_cxx11_(pPVar1);
          poVar6 = std::operator<<(poVar6,(string *)psVar8);
          poVar6 = std::operator<<(poVar6," removed ");
          local_64 = Attack;
          pmVar7 = std::
                   map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                   ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                                 *)&local_60,&local_64);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*pmVar7);
          poVar6 = std::operator<<(poVar6," life points since he is outside manhattan");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
    }
  }
  local_64 = Destruction;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)&local_60,&local_64);
  local_64 = Heal;
  pmVar7 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                         *)&local_60,&local_64);
  if ((0 < *pmVar7) && (iVar4 = Player::getZone(this_00), 6 < iVar4)) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Player: ");
    psVar8 = Player::getPlayerName_abi_cxx11_(this_00);
    poVar6 = std::operator<<(poVar6,(string *)psVar8);
    poVar6 = std::operator<<(poVar6," can add ");
    local_64 = Heal;
    pmVar7 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                           *)&local_60,&local_64);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,*pmVar7);
    poVar6 = std::operator<<(poVar6," health points");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  local_64 = Celebrity;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)&local_60,&local_64);
  local_64 = Ouch;
  std::
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::operator[]((map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
                *)&local_60,&local_64);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "****************************************************************************"
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void DiceEffectsObserver::update() {

    dynamic_cast<Dice*>(concreteSubject)->diceHistoricalValues();

    auto currentPlayer = Game::getPlayerByID(dynamic_cast<Dice*>(concreteSubject)->getPlayerNumber());

    map<Dice::DiceOptions, int> unresolvedHand = currentPlayer->getDice()->DiceValues;

    cout << "\n****************************************************************************" << endl;

    cout << "-------------------- DICE EFFECT OBSERVER ----------------------------------" << endl;

    cout << "****************************************************************************" << endl;
    cout << "*************  The potential effect of your roll is : **********************" << endl;

    if(unresolvedHand[Dice::Energy] > 0){ // Energy option
        cout << "Player: "<< currentPlayer->getPlayerName() << " added " << unresolvedHand[Dice::Energy] << " energy points" << endl;
    }

    if(unresolvedHand[Dice::Attack] > 0){ // Attack option
        if(currentPlayer->getZone()>0 && currentPlayer->getZone() < 7) { // In Manhattan
            for(auto tempPlayer : Game::players){
                if(tempPlayer->getZone() > 6){ // All players outside manhattan get -1 health
                    cout << "Player: "<< tempPlayer->getPlayerName() << " removed " << unresolvedHand[Dice::Attack] << " life points since he is outside manhattan" << endl;
                }
            }
        }
        else if(currentPlayer->getZone() > 6){ // Outside manhattan
            for(auto tempPlayer : Game::players){
                if(tempPlayer->getPlayerName() == currentPlayer->getPlayerName()){
                    continue;
                }
                if(tempPlayer->getZone() > 0 && tempPlayer->getZone() < 7){ // All players inside manhattan get -1 health
                    cout << "Player: "<< tempPlayer->getPlayerName() << " removed " << unresolvedHand[Dice::Attack] << " life points since he is inside manhattan" << endl;
                }
            }
        }
    }

    if(unresolvedHand[Dice::Destruction] > 0) { // Destruction option

    }

    if(unresolvedHand[Dice::Heal] > 0 && currentPlayer->getZone() >6) { // Heal Option
        cout << "Player: "<< currentPlayer->getPlayerName() << " can add " << unresolvedHand[Dice::Heal] << " health points" << endl;

    }

    if(unresolvedHand[Dice::Celebrity] > 0) { // Celebrity Option

    }

    if(unresolvedHand[Dice::Ouch] > 0) { // Ouch Option

    }
    cout << "****************************************************************************" << endl;

}